

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::DefineGroupNode::AccumDefineGroups
          (DefineGroupNode *this,ScriptContext *scriptContext,int *minGroup,int *maxGroup)

{
  int iVar1;
  
  ThreadContext::ProbeStackNoDispose(scriptContext->threadContext,0x6000,scriptContext,(PVOID)0x0);
  iVar1 = this->groupId;
  if (iVar1 < *minGroup) {
    *minGroup = iVar1;
    iVar1 = this->groupId;
  }
  if (*maxGroup < iVar1) {
    *maxGroup = iVar1;
  }
  (*this->body->_vptr_Node[0x10])(this->body,scriptContext,minGroup,maxGroup);
  return;
}

Assistant:

void DefineGroupNode::AccumDefineGroups(Js::ScriptContext* scriptContext, int& minGroup, int& maxGroup)
    {
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackRegex);

        if (groupId < minGroup)
            minGroup = groupId;
        if (groupId > maxGroup)
            maxGroup = groupId;
        body->AccumDefineGroups(scriptContext, minGroup, maxGroup);
    }